

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void BFS(void)

{
  Table state;
  Table b;
  Table possibleState;
  Table possibleState_00;
  Table currentState_00;
  Table state_00;
  Table state_01;
  Table state_02;
  Table state_03;
  int row;
  int col;
  bool bVar1;
  long *plVar2;
  int iVar3;
  Table currentState;
  Heuristics heuristics;
  Table local_1a8;
  Table local_190;
  Cell local_178 [2] [3];
  Cell CStack_172;
  Cell CStack_171;
  char cStack_170;
  undefined2 uStack_16f;
  undefined1 uStack_16d;
  int local_164;
  Cell local_160 [2] [3];
  Cell CStack_15a;
  Cell CStack_159;
  char cStack_158;
  undefined2 uStack_157;
  undefined1 uStack_155;
  int local_14c;
  Cell local_148 [2] [3];
  Cell CStack_142;
  Cell CStack_141;
  char cStack_140;
  undefined2 uStack_13f;
  undefined1 uStack_13d;
  int local_134;
  Cell local_130 [2] [3];
  Cell CStack_12a;
  Cell CStack_129;
  char cStack_128;
  undefined2 uStack_127;
  undefined1 uStack_125;
  int local_11c;
  Heuristics local_118;
  
  local_1a8.current_row = 1;
  local_1a8.current_col = 1;
  local_1a8.table[0][0].number = '1';
  local_1a8.table[0][1].number = '3';
  local_1a8.table[0][2].number = '6';
  local_1a8.table[1][0].number = '4';
  local_1a8.table[1][1].number = ' ';
  local_1a8.table[1][2].number = '2';
  local_1a8.table[2][0].number = '7';
  local_1a8.table[2][1].number = '5';
  local_1a8.table[2][2].number = '8';
  Heuristics::Heuristics(&local_118);
  state.evaluationScore = local_1a8.evaluationScore;
  state.current_col = local_1a8.current_col;
  state.current_row = local_1a8.current_row;
  state.table[2][2].number = local_1a8.table[2][2].number;
  state._9_3_ = local_1a8._9_3_;
  state.table[0][0].number = local_1a8.table[0][0].number;
  state.table[0][1].number = local_1a8.table[0][1].number;
  state.table[0][2].number = local_1a8.table[0][2].number;
  state.table[1][0].number = local_1a8.table[1][0].number;
  state.table[1][1].number = local_1a8.table[1][1].number;
  state.table[1][2].number = local_1a8.table[1][2].number;
  state.table[2][0].number = local_1a8.table[2][0].number;
  state.table[2][1].number = local_1a8.table[2][1].number;
  Heuristics::addToFrontierBFS(&local_118,state);
  iVar3 = 0;
  do {
    b.table[2][2].number = local_118.targetState.table[2][2].number;
    b._9_3_ = local_118.targetState._9_3_;
    b.current_row = local_118.targetState.current_row;
    b.table[0][0].number = local_118.targetState.table[0][0].number;
    b.table[0][1].number = local_118.targetState.table[0][1].number;
    b.table[0][2].number = local_118.targetState.table[0][2].number;
    b.table[1][0].number = local_118.targetState.table[1][0].number;
    b.table[1][1].number = local_118.targetState.table[1][1].number;
    b.table[1][2].number = local_118.targetState.table[1][2].number;
    b.table[2][0].number = local_118.targetState.table[2][0].number;
    b.table[2][1].number = local_118.targetState.table[2][1].number;
    b.current_col = local_118.targetState.current_col;
    b.evaluationScore = local_118.targetState.evaluationScore;
    bVar1 = Table::equals(&local_1a8,b);
    if ((bVar1) ||
       (local_118.frontierQ.c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        local_118.frontierQ.c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur)) goto LAB_00101c15;
    Heuristics::popFromFrontierBFS(&local_190,&local_118);
    while( true ) {
      local_1a8.current_col = local_190.current_col;
      local_1a8.evaluationScore = local_190.evaluationScore;
      local_1a8._9_2_ = local_190._9_2_;
      local_1a8.table[2][2].number = local_190.table[2][2].number;
      local_1a8._11_1_ = local_190._11_1_;
      local_1a8.table[0][0].number = local_190.table[0][0].number;
      local_1a8.table[0][1].number = local_190.table[0][1].number;
      local_1a8.table[0][2].number = local_190.table[0][2].number;
      local_1a8.table[1][0].number = local_190.table[1][0].number;
      local_1a8.table[1][1].number = local_190.table[1][1].number;
      local_1a8.table[1][2].number = local_190.table[1][2].number;
      local_1a8.table[2][0].number = local_190.table[2][0].number;
      local_1a8.table[2][1].number = local_190.table[2][1].number;
      local_1a8.current_row = local_190.current_row;
      if (local_118.frontierQ.c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          local_118.frontierQ.c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) break;
      possibleState.evaluationScore = local_190.evaluationScore;
      possibleState.current_col = local_190.current_col;
      possibleState.current_row = local_190.current_row;
      possibleState.table[2][2].number = local_190.table[2][2].number;
      possibleState._9_3_ = local_1a8._9_3_;
      possibleState.table[0][0].number = local_190.table[0][0].number;
      possibleState.table[0][1].number = local_190.table[0][1].number;
      possibleState.table[0][2].number = local_190.table[0][2].number;
      possibleState.table[1][0].number = local_190.table[1][0].number;
      possibleState.table[1][1].number = local_190.table[1][1].number;
      possibleState.table[1][2].number = local_190.table[1][2].number;
      possibleState.table[2][0].number = local_190.table[2][0].number;
      possibleState.table[2][1].number = local_190.table[2][1].number;
      bVar1 = Heuristics::existsInVisited(&local_118,possibleState);
      if (!bVar1) break;
      Heuristics::popFromFrontierBFS(&local_190,&local_118);
    }
    if (local_118.frontierQ.c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur !=
        local_118.frontierQ.c.super__Deque_base<Table,_std::allocator<Table>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur) {
      possibleState_00.evaluationScore = local_1a8.evaluationScore;
      possibleState_00.current_col = local_1a8.current_col;
      possibleState_00.current_row = local_1a8.current_row;
      possibleState_00.table[2][2].number = local_1a8.table[2][2].number;
      possibleState_00._9_3_ = local_1a8._9_3_;
      possibleState_00.table[0][0].number = local_1a8.table[0][0].number;
      possibleState_00.table[0][1].number = local_1a8.table[0][1].number;
      possibleState_00.table[0][2].number = local_1a8.table[0][2].number;
      possibleState_00.table[1][0].number = local_1a8.table[1][0].number;
      possibleState_00.table[1][1].number = local_1a8.table[1][1].number;
      possibleState_00.table[1][2].number = local_1a8.table[1][2].number;
      possibleState_00.table[2][0].number = local_1a8.table[2][0].number;
      possibleState_00.table[2][1].number = local_1a8.table[2][1].number;
      bVar1 = Heuristics::existsInVisited(&local_118,possibleState_00);
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"No solution",0xb);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
        std::ostream::put('p');
        std::ostream::flush();
LAB_00101c15:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Different states visited: ",0x1a);
        plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
        std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
        std::ostream::put((char)plVar2);
        std::ostream::flush();
        if (local_118.evaluatedChildren.super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.evaluatedChildren.
                          super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.evaluatedChildren.
                                super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.evaluatedChildren.
                                super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        std::_Deque_base<Table,_std::allocator<Table>_>::~_Deque_base
                  ((_Deque_base<Table,_std::allocator<Table>_> *)&local_118.frontierQ);
        std::_Deque_base<Table,_std::allocator<Table>_>::~_Deque_base
                  ((_Deque_base<Table,_std::allocator<Table>_> *)&local_118.frontier);
        if (local_118.visited.super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.visited.super__Vector_base<Table,_std::allocator<Table>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_118.visited.super__Vector_base<Table,_std::allocator<Table>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.visited.super__Vector_base<Table,_std::allocator<Table>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        return;
      }
    }
    currentState_00.evaluationScore = local_1a8.evaluationScore;
    currentState_00.current_col = local_1a8.current_col;
    currentState_00.current_row = local_1a8.current_row;
    currentState_00.table[2][2].number = local_1a8.table[2][2].number;
    currentState_00._9_3_ = local_1a8._9_3_;
    currentState_00.table[0][0].number = local_1a8.table[0][0].number;
    currentState_00.table[0][1].number = local_1a8.table[0][1].number;
    currentState_00.table[0][2].number = local_1a8.table[0][2].number;
    currentState_00.table[1][0].number = local_1a8.table[1][0].number;
    currentState_00.table[1][1].number = local_1a8.table[1][1].number;
    currentState_00.table[1][2].number = local_1a8.table[1][2].number;
    currentState_00.table[2][0].number = local_1a8.table[2][0].number;
    currentState_00.table[2][1].number = local_1a8.table[2][1].number;
    Heuristics::addToVisited(&local_118,currentState_00);
    col = local_1a8.current_col;
    row = local_1a8.current_row;
    if (0 < local_1a8.current_row) {
      Table::move(&local_190,&local_1a8,up,local_1a8.current_row,local_1a8.current_col);
      local_130[0][0].number = local_190.table[0][0].number;
      local_130[0][1].number = local_190.table[0][1].number;
      local_130[0][2].number = local_190.table[0][2].number;
      local_130[1][0].number = local_190.table[1][0].number;
      local_130[1][1].number = local_190.table[1][1].number;
      local_130[1][2].number = local_190.table[1][2].number;
      CStack_12a.number = local_190.table[2][0].number;
      CStack_129.number = local_190.table[2][1].number;
      cStack_128 = local_190.table[2][2].number;
      uStack_125 = local_190._11_1_;
      uStack_127 = local_190._9_2_;
      local_11c = local_190.evaluationScore;
      state_00.evaluationScore = local_190.evaluationScore;
      state_00.current_col = local_190.current_col;
      state_00._9_2_ = local_190._9_2_;
      state_00.table[2][2].number = local_190.table[2][2].number;
      state_00._11_1_ = local_190._11_1_;
      state_00.current_row = local_190.current_row;
      state_00.table[0][0].number = local_190.table[0][0].number;
      state_00.table[0][1].number = local_190.table[0][1].number;
      state_00.table[0][2].number = local_190.table[0][2].number;
      state_00.table[1][0].number = local_190.table[1][0].number;
      state_00.table[1][1].number = local_190.table[1][1].number;
      state_00.table[1][2].number = local_190.table[1][2].number;
      state_00.table[2][0].number = local_190.table[2][0].number;
      state_00.table[2][1].number = local_190.table[2][1].number;
      Heuristics::addToFrontierBFS(&local_118,state_00);
    }
    if (row < 2) {
      Table::move(&local_190,&local_1a8,down,row,col);
      local_148[0][0].number = local_190.table[0][0].number;
      local_148[0][1].number = local_190.table[0][1].number;
      local_148[0][2].number = local_190.table[0][2].number;
      local_148[1][0].number = local_190.table[1][0].number;
      local_148[1][1].number = local_190.table[1][1].number;
      local_148[1][2].number = local_190.table[1][2].number;
      CStack_142.number = local_190.table[2][0].number;
      CStack_141.number = local_190.table[2][1].number;
      cStack_140 = local_190.table[2][2].number;
      uStack_13d = local_190._11_1_;
      uStack_13f = local_190._9_2_;
      local_134 = local_190.evaluationScore;
      state_01.evaluationScore = local_190.evaluationScore;
      state_01.current_col = local_190.current_col;
      state_01._9_2_ = local_190._9_2_;
      state_01.table[2][2].number = local_190.table[2][2].number;
      state_01._11_1_ = local_190._11_1_;
      state_01.current_row = local_190.current_row;
      state_01.table[0][0].number = local_190.table[0][0].number;
      state_01.table[0][1].number = local_190.table[0][1].number;
      state_01.table[0][2].number = local_190.table[0][2].number;
      state_01.table[1][0].number = local_190.table[1][0].number;
      state_01.table[1][1].number = local_190.table[1][1].number;
      state_01.table[1][2].number = local_190.table[1][2].number;
      state_01.table[2][0].number = local_190.table[2][0].number;
      state_01.table[2][1].number = local_190.table[2][1].number;
      Heuristics::addToFrontierBFS(&local_118,state_01);
    }
    if (0 < col) {
      Table::move(&local_190,&local_1a8,left,row,col);
      local_160[0][0].number = local_190.table[0][0].number;
      local_160[0][1].number = local_190.table[0][1].number;
      local_160[0][2].number = local_190.table[0][2].number;
      local_160[1][0].number = local_190.table[1][0].number;
      local_160[1][1].number = local_190.table[1][1].number;
      local_160[1][2].number = local_190.table[1][2].number;
      CStack_15a.number = local_190.table[2][0].number;
      CStack_159.number = local_190.table[2][1].number;
      cStack_158 = local_190.table[2][2].number;
      uStack_155 = local_190._11_1_;
      uStack_157 = local_190._9_2_;
      local_14c = local_190.evaluationScore;
      state_02.evaluationScore = local_190.evaluationScore;
      state_02.current_col = local_190.current_col;
      state_02._9_2_ = local_190._9_2_;
      state_02.table[2][2].number = local_190.table[2][2].number;
      state_02._11_1_ = local_190._11_1_;
      state_02.current_row = local_190.current_row;
      state_02.table[0][0].number = local_190.table[0][0].number;
      state_02.table[0][1].number = local_190.table[0][1].number;
      state_02.table[0][2].number = local_190.table[0][2].number;
      state_02.table[1][0].number = local_190.table[1][0].number;
      state_02.table[1][1].number = local_190.table[1][1].number;
      state_02.table[1][2].number = local_190.table[1][2].number;
      state_02.table[2][0].number = local_190.table[2][0].number;
      state_02.table[2][1].number = local_190.table[2][1].number;
      Heuristics::addToFrontierBFS(&local_118,state_02);
    }
    if (col < 2) {
      Table::move(&local_190,&local_1a8,right,row,col);
      local_178[0][0].number = local_190.table[0][0].number;
      local_178[0][1].number = local_190.table[0][1].number;
      local_178[0][2].number = local_190.table[0][2].number;
      local_178[1][0].number = local_190.table[1][0].number;
      local_178[1][1].number = local_190.table[1][1].number;
      local_178[1][2].number = local_190.table[1][2].number;
      CStack_172.number = local_190.table[2][0].number;
      CStack_171.number = local_190.table[2][1].number;
      cStack_170 = local_190.table[2][2].number;
      uStack_16d = local_190._11_1_;
      uStack_16f = local_190._9_2_;
      local_164 = local_190.evaluationScore;
      state_03.evaluationScore = local_190.evaluationScore;
      state_03.current_col = local_190.current_col;
      state_03._9_2_ = local_190._9_2_;
      state_03.table[2][2].number = local_190.table[2][2].number;
      state_03._11_1_ = local_190._11_1_;
      state_03.current_row = local_190.current_row;
      state_03.table[0][0].number = local_190.table[0][0].number;
      state_03.table[0][1].number = local_190.table[0][1].number;
      state_03.table[0][2].number = local_190.table[0][2].number;
      state_03.table[1][0].number = local_190.table[1][0].number;
      state_03.table[1][1].number = local_190.table[1][1].number;
      state_03.table[1][2].number = local_190.table[1][2].number;
      state_03.table[2][0].number = local_190.table[2][0].number;
      state_03.table[2][1].number = local_190.table[2][1].number;
      Heuristics::addToFrontierBFS(&local_118,state_03);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void BFS() {
    Table currentState = Table();
    Table possibleState;
    Heuristics heuristics = Heuristics();
    heuristics.addToFrontierBFS(currentState);
    int row;
    int col;
    int counter = 0;
    while ((!currentState.equals(heuristics.targetState)) && !heuristics.frontierQ.empty()){
        currentState = heuristics.popFromFrontierBFS();
        while(!heuristics.frontierQ.empty() && heuristics.existsInVisited(currentState)) {
            currentState = heuristics.popFromFrontierBFS();
        }
        if (!heuristics.frontierQ.empty() && heuristics.existsInVisited(currentState)){
            std::cout << "No solution" << std::endl;
            break;
        }
        heuristics.addToVisited(currentState);
        row = currentState.current_row;
        col = currentState.current_col;
        if (row - 1 >= 0) {
            possibleState = currentState.move(Table::up, row, col);
            heuristics.addToFrontierBFS(possibleState);
        }
        if (row + 1 < 3) {
            possibleState = currentState.move(Table::down, row, col);
            heuristics.addToFrontierBFS(possibleState);
        }
        if (col - 1 >= 0) {
            possibleState = currentState.move(Table::left, row, col);
            heuristics.addToFrontierBFS(possibleState);
        }
        if (col + 1 < 3) {
            possibleState = currentState.move(Table::right, row, col);
            heuristics.addToFrontierBFS(possibleState);
        }
        counter++;
    }
    std::cout << "Different states visited: " << counter << std::endl;
}